

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall
QSplitterPrivate::addContribution
          (QSplitterPrivate *this,int index,int *min,int *max,bool mayCollapse)

{
  QSplitterLayoutStruct *pQVar1;
  bool bVar2;
  int iVar3;
  const_reference ppQVar4;
  int *in_RCX;
  int *in_RDX;
  undefined8 in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  QSplitterLayoutStruct *s;
  undefined4 in_stack_ffffffffffffff98;
  Orientation in_stack_ffffffffffffff9c;
  QSplitterPrivate *in_stack_ffffffffffffffa0;
  QSplitterPrivate *this_00;
  QFlagsStorage<Qt::AlignmentFlag> align;
  undefined1 local_1c [4];
  QSize local_18;
  QSize local_10;
  long local_8;
  
  align.i = (Int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ppQVar4 = QList<QSplitterLayoutStruct_*>::at
                      ((QList<QSplitterLayoutStruct_*> *)in_stack_ffffffffffffffa0,
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pQVar1 = *ppQVar4;
  bVar2 = QWidget::isHidden((QWidget *)0x69ae73);
  if (!bVar2) {
    bVar2 = QWidget::isHidden((QWidget *)0x69ae89);
    if (!bVar2) {
      iVar3 = QSplitterLayoutStruct::getHandleSize
                        ((QSplitterLayoutStruct *)in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
      *in_RDX = iVar3 + *in_RDX;
      iVar3 = QSplitterLayoutStruct::getHandleSize
                        ((QSplitterLayoutStruct *)in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
      *in_RCX = iVar3 + *in_RCX;
    }
    if (((in_R8B & 1) != 0) || ((pQVar1->field_0x14 & 1) == 0)) {
      local_10 = qSmartMinSize((QWidget *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      iVar3 = pick(in_stack_ffffffffffffffa0,
                   (QSize *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      *in_RDX = iVar3 + *in_RDX;
    }
    this_00 = (QSplitterPrivate *)pQVar1->widget;
    memset(local_1c,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x69af3c);
    local_18 = qSmartMaxSize((QWidget *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             (Alignment)align.i);
    iVar3 = pick(this_00,(QSize *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    *in_RCX = iVar3 + *in_RCX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitterPrivate::addContribution(int index, int *min, int *max, bool mayCollapse) const
{
    QSplitterLayoutStruct *s = list.at(index);
    if (!s->widget->isHidden()) {
        if (!s->handle->isHidden()) {
            *min += s->getHandleSize(orient);
            *max += s->getHandleSize(orient);
        }
        if (mayCollapse || !s->collapsed)
            *min += pick(qSmartMinSize(s->widget));

        *max += pick(qSmartMaxSize(s->widget));
    }
}